

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O2

void write_safe_str(FIOBJ dest,FIOBJ str)

{
  long lVar1;
  char *pcVar2;
  byte bVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong size;
  size_t size_00;
  ulong uVar10;
  fio_str_info_s t;
  fio_str_info_s tmp;
  fio_str_info_s s;
  fio_str_info_s local_78;
  fio_str_info_s local_60;
  fio_str_info_s local_48;
  
  fiobj_obj2cstr(&local_48,str);
  fiobj_obj2cstr(&local_78,dest);
  local_78.data[local_78.len] = '\"';
  local_78.len = local_78.len + 1;
  fiobj_str_resize(dest,local_78.len);
  fiobj_obj2cstr(&local_60,dest);
  uVar6 = local_48.len;
  size_00 = local_60.len;
  local_78.data = local_60.data;
  local_78.capa = local_60.capa;
  local_78.len = local_60.len;
  sVar4 = fiobj_str_capa(dest);
  sVar7 = size_00 + local_48.len + 0x40;
  if (sVar4 <= sVar7) {
    sVar4 = fiobj_str_capa_assert(dest,sVar7);
    fiobj_obj2cstr(&local_60,dest);
    local_78.data = local_60.data;
    local_78.capa = local_60.capa;
    local_78.len = local_60.len;
  }
LAB_00151b65:
  uVar9 = 0;
  sVar7 = size_00;
LAB_00151b68:
  uVar8 = uVar6;
  pcVar5 = local_48.data;
  if (uVar8 == 0) {
LAB_00151d0f:
    local_78.data[sVar7] = '\"';
    fiobj_str_resize(dest,sVar7 + 1);
    return;
  }
  uVar10 = 0;
  do {
    if (uVar8 == uVar10) {
      sVar7 = sVar7 + uVar10;
      goto LAB_00151d0f;
    }
    bVar3 = pcVar5[uVar10];
    if (bVar3 < 0x21) {
      switch(bVar3) {
      case 8:
        (local_78.data + sVar7 + uVar10)[0] = '\\';
        (local_78.data + sVar7 + uVar10)[1] = 'b';
        goto LAB_00151c73;
      case 9:
        (local_78.data + sVar7 + uVar10)[0] = '\\';
        (local_78.data + sVar7 + uVar10)[1] = 't';
        goto LAB_00151c73;
      case 10:
        (local_78.data + sVar7 + uVar10)[0] = '\\';
        (local_78.data + sVar7 + uVar10)[1] = 'n';
        goto LAB_00151c73;
      case 0xb:
        goto switchD_00151bda_caseD_b;
      case 0xc:
        (local_78.data + sVar7 + uVar10)[0] = '\\';
        (local_78.data + sVar7 + uVar10)[1] = 'f';
        goto LAB_00151c73;
      case 0xd:
        (local_78.data + sVar7 + uVar10)[0] = '\\';
        (local_78.data + sVar7 + uVar10)[1] = 'r';
        goto LAB_00151c73;
      default:
        if (bVar3 == 0x20) {
          size_00 = sVar7 + uVar10 + 1;
          local_78.data[sVar7 + uVar10] = ' ';
          break;
        }
switchD_00151bda_caseD_b:
        lVar1 = sVar7 + uVar10;
        pcVar2 = local_78.data + lVar1;
        pcVar2[0] = '\\';
        pcVar2[1] = 'u';
        pcVar2[2] = '0';
        pcVar2[3] = '0';
        local_78.data[lVar1 + 4] = "0123456789ABCDEF"[(byte)pcVar5[uVar10] >> 4];
        size_00 = sVar7 + uVar10 + 6;
        local_78.data[lVar1 + 5] = "0123456789ABCDEF"[(byte)pcVar5[uVar10] & 0xf];
        uVar9 = uVar9 + 4;
      }
      goto LAB_00151c76;
    }
    if ((bVar3 == 0x22) || (bVar3 == 0x5c)) break;
    local_78.data[uVar10 + sVar7] = bVar3;
    uVar10 = uVar10 + 1;
  } while( true );
  local_78.data[sVar7 + uVar10] = '\\';
  local_78.data[sVar7 + uVar10 + 1] = pcVar5[uVar10];
LAB_00151c73:
  size_00 = sVar7 + uVar10 + 2;
  uVar9 = uVar9 + 1;
LAB_00151c76:
  uVar6 = ~uVar10 + uVar8;
  local_48.data = pcVar5 + uVar10 + 1;
  sVar7 = size_00;
  if ((uVar9 < 0x30) || (size = ((size_00 + uVar8) - uVar10) + 0x3f, size < sVar4))
  goto LAB_00151b68;
  local_78.data[size_00] = '\0';
  fiobj_str_resize(dest,size_00);
  fiobj_str_capa_assert(dest,size);
  fiobj_obj2cstr(&local_60,dest);
  local_78.data = local_60.data;
  local_78.capa = local_60.capa;
  local_78.len = local_60.len;
  local_48.data = pcVar5 + uVar10 + 1;
  uVar6 = ~uVar10 + uVar8;
  sVar4 = local_60.capa;
  goto LAB_00151b65;
}

Assistant:

static void write_safe_str(FIOBJ dest, const FIOBJ str) {
  fio_str_info_s s = fiobj_obj2cstr(str);
  fio_str_info_s t = fiobj_obj2cstr(dest);
  t.data[t.len] = '"';
  t.len++;
  fiobj_str_resize(dest, t.len);
  t = fiobj_obj2cstr(dest);
  const uint8_t *restrict src = (const uint8_t *)s.data;
  size_t len = s.len;
  uint64_t end = t.len;
  /* make sure we have some room */
  size_t added = 0;
  size_t capa = fiobj_str_capa(dest);
  if (capa <= end + s.len + 64) {
    if (0) {
      capa = (((capa >> 12) + 1) << 12) - 1;
      capa = fiobj_str_capa_assert(dest, capa);
    } else {
      capa = fiobj_str_capa_assert(dest, (end + s.len + 64));
    }
    fio_str_info_s tmp = fiobj_obj2cstr(dest);
    t = tmp;
  }
  while (len) {
    char *restrict writer = (char *)t.data;
    while (len && src[0] > 32 && src[0] != '"' && src[0] != '\\') {
      len--;
      writer[end++] = *(src++);
    }
    if (!len)
      break;
    switch (src[0]) {
    case '\b':
      writer[end++] = '\\';
      writer[end++] = 'b';
      added++;
      break; /* from switch */
    case '\f':
      writer[end++] = '\\';
      writer[end++] = 'f';
      added++;
      break; /* from switch */
    case '\n':
      writer[end++] = '\\';
      writer[end++] = 'n';
      added++;
      break; /* from switch */
    case '\r':
      writer[end++] = '\\';
      writer[end++] = 'r';
      added++;
      break; /* from switch */
    case '\t':
      writer[end++] = '\\';
      writer[end++] = 't';
      added++;
      break; /* from switch */
    case '"':
    case '\\':
    case '/':
      writer[end++] = '\\';
      writer[end++] = src[0];
      added++;
      break; /* from switch */
    default:
      if (src[0] <= 31) {
        /* MUST escape all control values less than 32 */
        writer[end++] = '\\';
        writer[end++] = 'u';
        writer[end++] = '0';
        writer[end++] = '0';
        writer[end++] = hex_chars[src[0] >> 4];
        writer[end++] = hex_chars[src[0] & 15];
        added += 4;
      } else
        writer[end++] = src[0];
      break; /* from switch */
    }
    src++;
    len--;
    if (added >= 48 && capa <= end + len + 64) {
      writer[end] = 0;
      fiobj_str_resize(dest, end);
      fiobj_str_capa_assert(dest, (end + len + 64));
      t = fiobj_obj2cstr(dest);
      writer = (char *)t.data;
      capa = t.capa;
      added = 0;
    }
  }
  t.data[end++] = '"';
  fiobj_str_resize(dest, end);
}